

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPReader.h
# Opt level: O1

void __thiscall BMPReader::~BMPReader(BMPReader *this)

{
  if (this->rgbData != (RGB *)0x0) {
    operator_delete__(this->rgbData);
    this->rgbData = (RGB *)0x0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Delete BMPReader::rgbData",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  return;
}

Assistant:

~BMPReader() {
		if (rgbData) {
			delete[] rgbData; 
			rgbData = nullptr;
			std::cout << "Delete BMPReader::rgbData" << std::endl;
		}
	}